

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

StringPool * pool_new(size_t num_entries,size_t num_keys,xmlChar id)

{
  StringPool *pSVar1;
  size_t sVar2;
  xmlChar **ppxVar3;
  size_t num_strings;
  StringPool *ret;
  xmlChar id_local;
  size_t num_keys_local;
  size_t num_entries_local;
  
  pSVar1 = (StringPool *)(*_xmlMalloc)(0x30);
  pSVar1->num_entries = num_entries;
  pSVar1->num_keys = num_keys;
  sVar2 = num_entries * num_keys;
  ppxVar3 = (xmlChar **)(*_xmlMalloc)(sVar2 * 8);
  pSVar1->strings = ppxVar3;
  memset(pSVar1->strings,0,sVar2 * 8);
  pSVar1->num_strings = sVar2;
  pSVar1->index = 0;
  pSVar1->id = id;
  return pSVar1;
}

Assistant:

static StringPool *
pool_new(size_t num_entries, size_t num_keys, xmlChar id) {
    StringPool *ret;
    size_t num_strings;

    ret = xmlMalloc(sizeof(*ret));
    ret->num_entries = num_entries;
    ret->num_keys = num_keys;
    num_strings = num_entries * num_keys;
    ret->strings = xmlMalloc(num_strings * sizeof(ret->strings[0]));
    memset(ret->strings, 0, num_strings * sizeof(ret->strings[0]));
    ret->num_strings = num_strings;
    ret->index = 0;
    ret->id = id;

    return ret;
}